

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O2

size_t ZSTD_decompressBlock_internal
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,int frame)

{
  byte bVar1;
  byte bVar2;
  BYTE BVar3;
  ulong uVar4;
  seq_t sequence;
  seq_t sequence_00;
  seq_t sequence_01;
  BIT_DStream_status BVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  BYTE *op_2;
  size_t sVar9;
  size_t sVar10;
  long lVar11;
  BYTE *pBVar12;
  BYTE *pBVar13;
  byte bVar14;
  BYTE *pBVar15;
  BYTE *pBVar16;
  ulong uVar17;
  BYTE *pBVar18;
  size_t __n;
  ulong uVar19;
  size_t sVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  BYTE *pBVar24;
  uint uVar25;
  BYTE *oend;
  void *srcBuffer;
  ulong uVar26;
  BYTE *pBVar27;
  BYTE *pBVar28;
  BYTE **ppBVar29;
  BYTE *ip_5;
  ZSTD_longOffset_e in_stack_fffffffffffffde8;
  BYTE *local_1c0;
  BYTE *litPtr;
  BYTE *local_1b0;
  BYTE *local_1a8;
  BIT_DStream_t local_1a0;
  ZSTD_fseState local_178;
  ZSTD_fseState local_168;
  ZSTD_fseState local_158;
  BYTE *local_148 [6];
  ulong local_118;
  int nbSeq;
  BYTE *local_108;
  BYTE *local_100;
  BYTE *local_f8;
  BYTE *local_f0;
  ulong *local_e8;
  ulong local_e0;
  int local_d4;
  BYTE *local_d0;
  size_t local_c8;
  BYTE *local_c0;
  seq_t sequences [4];
  
  if (0x1ffff < srcSize) {
    return 0xffffffffffffffb8;
  }
  sVar9 = ZSTD_decodeLiteralsBlock(dctx,src,srcSize);
  if (0xffffffffffffff88 < sVar9) {
    return sVar9;
  }
  iVar7 = dctx->ddictIsCold;
  sVar10 = ZSTD_decodeSeqHeaders(dctx,&nbSeq,(void *)((long)src + sVar9),srcSize - sVar9);
  if (0xffffffffffffff88 < sVar10) {
    return sVar10;
  }
  srcBuffer = (void *)((long)((long)src + sVar9) + sVar10);
  sVar10 = (srcSize - sVar9) - sVar10;
  local_1c0 = (BYTE *)dst;
  if (iVar7 == 0) {
    if (frame == 0) {
      if (nbSeq < 5) goto LAB_0013943d;
LAB_00139019:
      iVar7 = 0;
      for (uVar25 = 0; bVar14 = (byte)dctx->OFTptr->baseValue, uVar25 >> (bVar14 & 0x1f) == 0;
          uVar25 = uVar25 + 1) {
        iVar7 = (iVar7 + 1) - (uint)(dctx->OFTptr[(ulong)uVar25 + 1].nbAdditionalBits < 0x17);
      }
      dctx->ddictIsCold = 0;
      if (6 < (uint)(iVar7 << (8 - bVar14 & 0x1f))) goto LAB_00138fc4;
    }
    else {
      if (0x1000000 < (dctx->fParams).windowSize && 4 < nbSeq) goto LAB_00139019;
LAB_0013943d:
      dctx->ddictIsCold = 0;
    }
    if (dctx->bmi2 != 0) {
      sVar9 = ZSTD_decompressSequences_bmi2
                        (dctx,dst,dstCapacity,srcBuffer,sVar10,nbSeq,in_stack_fffffffffffffde8);
      return sVar9;
    }
    pBVar24 = (BYTE *)(dstCapacity + (long)dst);
    litPtr = dctx->litPtr;
    sVar9 = dctx->litSize;
    pBVar12 = litPtr + sVar9;
    if (nbSeq != 0) {
      pBVar12 = (BYTE *)dctx->prefixStart;
      local_e8 = (ulong *)dctx->virtualStart;
      local_1b0 = (BYTE *)dctx->dictEnd;
      dctx->fseEntropy = 1;
      for (lVar11 = -6; lVar11 != 0; lVar11 = lVar11 + 2) {
        *(ulong *)((long)local_148 + lVar11 * 4 + 0x18) =
             (ulong)*(uint *)((long)dctx->workspace + lVar11 * 2);
      }
      local_1a8 = litPtr + sVar9;
      sVar9 = BIT_initDStream(&local_1a0,srcBuffer,sVar10);
      if (0xffffffffffffff88 < sVar9) {
        return 0xffffffffffffffec;
      }
      ZSTD_initFseState(&local_178,&local_1a0,dctx->LLTptr);
      ZSTD_initFseState(&local_168,&local_1a0,dctx->OFTptr);
      ZSTD_initFseState(&local_158,&local_1a0,dctx->MLTptr);
      pBVar15 = pBVar24 + -8;
      local_108 = pBVar24 + -0xd;
      iVar7 = nbSeq;
      do {
        BVar5 = BIT_reloadDStream(&local_1a0);
        if ((BVar5 == BIT_DStream_overflow) || (iVar7 == 0)) {
          if (iVar7 != 0) {
            return 0xffffffffffffffec;
          }
          BVar5 = BIT_reloadDStream(&local_1a0);
          if (BVar5 < BIT_DStream_completed) {
            return 0xffffffffffffffec;
          }
          for (lVar11 = 0; pBVar12 = local_1a8, lVar11 != 3; lVar11 = lVar11 + 1) {
            (dctx->entropy).rep[lVar11] = *(U32 *)(local_148 + lVar11);
          }
          break;
        }
        bVar14 = local_178.table[local_178.state].nbAdditionalBits;
        bVar1 = local_158.table[local_158.state].nbAdditionalBits;
        bVar2 = local_168.table[local_168.state].nbAdditionalBits;
        uVar25 = local_178.table[local_178.state].baseValue;
        uVar8 = local_158.table[local_158.state].baseValue;
        uVar21 = (uint)bVar2;
        if (bVar2 == 0) {
          pBVar28 = (BYTE *)0x0;
LAB_00139c1b:
          pBVar16 = pBVar28 + ((ulong)uVar25 == 0);
          if (pBVar16 != (BYTE *)0x0) {
            if (pBVar16 == (BYTE *)0x3) {
              pBVar28 = local_148[0] + ((ulong)(local_148[0] == (BYTE *)0x1) - 1);
            }
            else {
              pBVar28 = local_148[(long)pBVar16] + (local_148[(long)pBVar16] == (BYTE *)0x0);
              if (pBVar16 == (BYTE *)0x1) goto LAB_00139c84;
            }
            local_148[2] = local_148[1];
            goto LAB_00139c84;
          }
        }
        else {
          pBVar28 = (BYTE *)(((local_1a0.bitContainer << ((byte)local_1a0.bitsConsumed & 0x3f)) >>
                             (-bVar2 & 0x3f)) + (ulong)local_168.table[local_168.state].baseValue);
          local_1a0.bitsConsumed = local_1a0.bitsConsumed + uVar21;
          if (uVar21 == 1) goto LAB_00139c1b;
          local_148[2] = local_148[1];
LAB_00139c84:
          local_148[1] = local_148[0];
          local_148[0] = pBVar28;
        }
        pBVar28 = local_148[0];
        if (bVar1 == 0) {
          uVar26 = 0;
        }
        else {
          uVar26 = (local_1a0.bitContainer << ((byte)local_1a0.bitsConsumed & 0x3f)) >>
                   (-bVar1 & 0x3f);
          local_1a0.bitsConsumed = local_1a0.bitsConsumed + bVar1;
        }
        if (0x1e < (uint)bVar1 + (uint)bVar14 + uVar21) {
          BIT_reloadDStream(&local_1a0);
        }
        if (bVar14 == 0) {
          uVar19 = 0;
        }
        else {
          uVar19 = (local_1a0.bitContainer << ((byte)local_1a0.bitsConsumed & 0x3f)) >>
                   (-bVar14 & 0x3f);
          local_1a0.bitsConsumed = local_1a0.bitsConsumed + bVar14;
        }
        sVar20 = uVar26 + uVar8;
        iVar6 = local_1a0.bitsConsumed + local_178.table[local_178.state].nbBits;
        local_178.state =
             (ulong)((uint)(local_1a0.bitContainer >> (-(char)iVar6 & 0x3fU)) &
                    BIT_mask[local_178.table[local_178.state].nbBits]) +
             (ulong)local_178.table[local_178.state].nextState;
        iVar6 = iVar6 + (uint)local_158.table[local_158.state].nbBits;
        sequences[0].litLength = uVar19 + uVar25;
        local_158.state =
             (ulong)((uint)(local_1a0.bitContainer >> (-(char)iVar6 & 0x3fU)) &
                    BIT_mask[local_158.table[local_158.state].nbBits]) +
             (ulong)local_158.table[local_158.state].nextState;
        local_1a0.bitsConsumed = iVar6 + (uint)local_168.table[local_168.state].nbBits;
        local_168.state =
             (ulong)((uint)(local_1a0.bitContainer >> (-(char)local_1a0.bitsConsumed & 0x3fU)) &
                    BIT_mask[local_168.table[local_168.state].nbBits]) +
             (ulong)local_168.table[local_168.state].nextState;
        uVar26 = sequences[0].litLength + sVar20;
        pBVar16 = local_1c0 + uVar26;
        if (pBVar24 < pBVar16) {
          return 0xffffffffffffffba;
        }
        pBVar13 = litPtr + sequences[0].litLength;
        if (local_1a8 < pBVar13) {
          return 0xffffffffffffffec;
        }
        pBVar27 = local_1c0 + sequences[0].litLength;
        sequences[0].matchLength = sVar20;
        sequences[0].offset = (size_t)pBVar28;
        if (pBVar15 < pBVar27) {
          sequence_00.matchLength = sVar20;
          sequence_00.litLength = sequences[0].litLength;
          sequence_00.offset = (size_t)pBVar28;
          sequence_00.match = sequences[0].match;
          sVar9 = ZSTD_execSequenceLast7
                            (local_1c0,pBVar24,sequence_00,&litPtr,local_1a8,pBVar12,
                             (BYTE *)local_e8,local_1b0);
        }
        else {
          *(undefined8 *)local_1c0 = *(undefined8 *)litPtr;
          if (8 < sequences[0].litLength) {
            pBVar18 = local_1c0 + 8;
            do {
              litPtr = litPtr + 8;
              *(undefined8 *)pBVar18 = *(undefined8 *)litPtr;
              pBVar18 = pBVar18 + 8;
            } while (pBVar18 < pBVar27);
          }
          pBVar18 = pBVar27 + -(long)pBVar28;
          litPtr = pBVar13;
          local_118 = uVar26;
          if (pBVar27 + -(long)pBVar12 < pBVar28) {
            if (pBVar27 + -(long)local_e8 < pBVar28) {
              return 0xffffffffffffffec;
            }
            lVar11 = (long)(pBVar27 + -(long)pBVar28) - (long)pBVar12;
            pBVar13 = local_1b0 + lVar11;
            if (local_1b0 < pBVar13 + sVar20) {
              memmove(pBVar27,pBVar13,-lVar11);
              pBVar27 = pBVar27 + -lVar11;
              sequences[0].matchLength = sVar20 + lVar11;
              if ((pBVar27 <= pBVar15) && (pBVar18 = pBVar12, 2 < sequences[0].matchLength))
              goto LAB_00139f21;
              for (uVar25 = 0; uVar26 = (ulong)uVar25, sVar9 = local_118,
                  uVar26 < sequences[0].matchLength; uVar25 = uVar25 + 1) {
                pBVar27[uVar26] = pBVar12[uVar26];
              }
            }
            else {
              memmove(pBVar27,pBVar13,sVar20);
              sVar9 = local_118;
            }
          }
          else {
LAB_00139f21:
            if (pBVar28 < (BYTE *)0x8) {
              iVar6 = *(int *)(ZSTD_execSequence_dec64table + (long)pBVar28 * 4);
              *pBVar27 = *pBVar18;
              pBVar27[1] = pBVar18[1];
              pBVar27[2] = pBVar18[2];
              pBVar27[3] = pBVar18[3];
              pBVar28 = pBVar18 + *(uint *)(ZSTD_execSequence_dec32table + sequences[0].offset * 4);
              pBVar18 = pBVar18 + ((ulong)*(uint *)(ZSTD_execSequence_dec32table +
                                                   sequences[0].offset * 4) - (long)iVar6);
              *(undefined4 *)(pBVar27 + 4) = *(undefined4 *)pBVar28;
            }
            else {
              *(undefined8 *)pBVar27 = *(undefined8 *)pBVar18;
            }
            pBVar28 = pBVar27 + 8;
            pBVar18 = pBVar18 + 8;
            sVar9 = local_118;
            if (local_108 < pBVar16) {
              pBVar13 = pBVar28;
              pBVar27 = pBVar18;
              if (pBVar28 < pBVar15) {
                do {
                  *(undefined8 *)pBVar13 = *(undefined8 *)pBVar27;
                  pBVar13 = pBVar13 + 8;
                  pBVar27 = pBVar27 + 8;
                } while (pBVar13 < pBVar15);
                pBVar18 = pBVar18 + ((long)pBVar15 - (long)pBVar28);
                pBVar28 = pBVar15;
              }
              for (; pBVar28 < pBVar16; pBVar28 = pBVar28 + 1) {
                BVar3 = *pBVar18;
                pBVar18 = pBVar18 + 1;
                *pBVar28 = BVar3;
              }
            }
            else {
              do {
                *(undefined8 *)pBVar28 = *(undefined8 *)pBVar18;
                pBVar28 = pBVar28 + 8;
                pBVar18 = pBVar18 + 8;
              } while (pBVar28 < pBVar27 + sequences[0].matchLength);
            }
          }
        }
        local_1c0 = local_1c0 + sVar9;
        iVar7 = iVar7 + -1;
        if (0xffffffffffffff88 < sVar9) {
          return sVar9;
        }
      } while( true );
    }
  }
  else {
    dctx->ddictIsCold = 0;
LAB_00138fc4:
    if (dctx->bmi2 != 0) {
      sVar9 = ZSTD_decompressSequencesLong_bmi2
                        (dctx,dst,dstCapacity,srcBuffer,sVar10,nbSeq,in_stack_fffffffffffffde8);
      return sVar9;
    }
    pBVar24 = (BYTE *)(dstCapacity + (long)dst);
    litPtr = dctx->litPtr;
    sVar9 = dctx->litSize;
    pBVar12 = litPtr + sVar9;
    if (nbSeq != 0) {
      local_1b0 = (BYTE *)dctx->prefixStart;
      local_f8 = (BYTE *)dctx->virtualStart;
      local_148[4] = (BYTE *)dctx->dictEnd;
      dctx->fseEntropy = 1;
      for (lVar11 = -6; lVar11 != 0; lVar11 = lVar11 + 2) {
        *(ulong *)((long)local_148 + lVar11 * 4 + 0x18) =
             (ulong)*(uint *)((long)dctx->workspace + lVar11 * 2);
      }
      iVar7 = 4;
      if (nbSeq < 4) {
        iVar7 = nbSeq;
      }
      local_148[5] = (BYTE *)((long)dst - (long)local_1b0);
      local_148[3] = local_1b0;
      local_108 = litPtr + sVar9;
      local_100 = local_148[4];
      sVar9 = BIT_initDStream(&local_1a0,srcBuffer,sVar10);
      if (0xffffffffffffff88 < sVar9) {
        return 0xffffffffffffffec;
      }
      local_c0 = pBVar24;
      ZSTD_initFseState(&local_178,&local_1a0,dctx->LLTptr);
      ZSTD_initFseState(&local_168,&local_1a0,dctx->OFTptr);
      ZSTD_initFseState(&local_158,&local_1a0,dctx->MLTptr);
      ppBVar29 = &sequences[0].match;
      local_d4 = iVar7;
      for (uVar26 = 0;
          (BVar5 = BIT_reloadDStream(&local_1a0), pBVar24 = local_c0, pBVar12 = local_148[1],
          BVar5 != BIT_DStream_overflow && ((long)uVar26 < (long)iVar7)); uVar26 = uVar26 + 1) {
        bVar14 = local_178.table[local_178.state].nbAdditionalBits;
        bVar1 = local_158.table[local_158.state].nbAdditionalBits;
        bVar2 = local_168.table[local_168.state].nbAdditionalBits;
        uVar25 = local_178.table[local_178.state].baseValue;
        uVar8 = local_158.table[local_158.state].baseValue;
        uVar21 = (uint)bVar2;
        if (bVar2 == 0) {
          pBVar24 = (BYTE *)0x0;
LAB_0013922b:
          pBVar12 = pBVar24 + ((ulong)uVar25 == 0);
          if (pBVar12 != (BYTE *)0x0) {
            if (pBVar12 == (BYTE *)0x3) {
              pBVar24 = local_148[0] + ((ulong)(local_148[0] == (BYTE *)0x1) - 1);
LAB_00139274:
              local_148[2] = local_148[1];
            }
            else {
              pBVar24 = local_148[(long)pBVar12] + (local_148[(long)pBVar12] == (BYTE *)0x0);
              if (pBVar12 != (BYTE *)0x1) goto LAB_00139274;
            }
            local_148[1] = local_148[0];
            goto LAB_00139294;
          }
        }
        else {
          pBVar24 = (BYTE *)(((local_1a0.bitContainer << ((byte)local_1a0.bitsConsumed & 0x3f)) >>
                             (-bVar2 & 0x3f)) + (ulong)local_168.table[local_168.state].baseValue);
          local_1a0.bitsConsumed = local_1a0.bitsConsumed + uVar21;
          if (uVar21 == 1) goto LAB_0013922b;
          local_148[1] = local_148[0];
          local_148[2] = pBVar12;
LAB_00139294:
          local_148[1] = local_148[0];
          local_148[0] = pBVar24;
        }
        pBVar24 = local_148[0];
        if (bVar1 == 0) {
          uVar19 = 0;
        }
        else {
          uVar19 = (local_1a0.bitContainer << ((byte)local_1a0.bitsConsumed & 0x3f)) >>
                   (-bVar1 & 0x3f);
          local_1a0.bitsConsumed = local_1a0.bitsConsumed + bVar1;
        }
        if (0x1e < (uint)bVar1 + (uint)bVar14 + uVar21) {
          BIT_reloadDStream(&local_1a0);
        }
        if (bVar14 == 0) {
          uVar23 = 0;
        }
        else {
          uVar23 = (local_1a0.bitContainer << ((byte)local_1a0.bitsConsumed & 0x3f)) >>
                   (-bVar14 & 0x3f);
          local_1a0.bitsConsumed = local_1a0.bitsConsumed + bVar14;
        }
        sVar9 = uVar19 + uVar8;
        sVar10 = uVar23 + uVar25;
        pBVar15 = local_148[5] + sVar10;
        pBVar12 = local_148[(ulong)(pBVar15 < pBVar24) + 3];
        local_148[5] = pBVar15 + sVar9;
        iVar6 = local_1a0.bitsConsumed + local_178.table[local_178.state].nbBits;
        local_178.state =
             (ulong)((uint)(local_1a0.bitContainer >> (-(char)iVar6 & 0x3fU)) &
                    BIT_mask[local_178.table[local_178.state].nbBits]) +
             (ulong)local_178.table[local_178.state].nextState;
        iVar6 = iVar6 + (uint)local_158.table[local_158.state].nbBits;
        local_158.state =
             (ulong)((uint)(local_1a0.bitContainer >> (-(char)iVar6 & 0x3fU)) &
                    BIT_mask[local_158.table[local_158.state].nbBits]) +
             (ulong)local_158.table[local_158.state].nextState;
        local_1a0.bitsConsumed = iVar6 + (uint)local_168.table[local_168.state].nbBits;
        local_168.state =
             (ulong)((uint)(local_1a0.bitContainer >> (-(char)local_1a0.bitsConsumed & 0x3fU)) &
                    BIT_mask[local_168.table[local_168.state].nbBits]) +
             (ulong)local_168.table[local_168.state].nextState;
        ((seq_t *)(ppBVar29 + -3))->litLength = sVar10;
        ppBVar29[-2] = (BYTE *)sVar9;
        ppBVar29[-1] = pBVar24;
        *ppBVar29 = pBVar15 + ((long)pBVar12 - (long)pBVar24);
        ppBVar29 = ppBVar29 + 4;
      }
      if ((long)uVar26 < (long)iVar7) {
        return 0xffffffffffffffec;
      }
      local_f0 = local_c0 + -8;
      local_d0 = local_c0 + -0xd;
      while( true ) {
        BVar5 = BIT_reloadDStream(&local_1a0);
        pBVar12 = local_148[1];
        uVar25 = (uint)uVar26;
        if ((BVar5 == BIT_DStream_overflow) || (nbSeq <= (int)uVar25)) break;
        bVar14 = local_178.table[local_178.state].nbAdditionalBits;
        bVar1 = local_158.table[local_158.state].nbAdditionalBits;
        bVar2 = local_168.table[local_168.state].nbAdditionalBits;
        uVar8 = local_178.table[local_178.state].baseValue;
        uVar21 = local_158.table[local_158.state].baseValue;
        uVar22 = (uint)bVar2;
        if (bVar2 == 0) {
          pBVar15 = (BYTE *)0x0;
LAB_001395d7:
          pBVar12 = pBVar15 + ((ulong)uVar8 == 0);
          if (pBVar12 != (BYTE *)0x0) {
            if (pBVar12 == (BYTE *)0x3) {
              pBVar15 = local_148[0] + ((ulong)(local_148[0] == (BYTE *)0x1) - 1);
LAB_00139620:
              local_148[2] = local_148[1];
            }
            else {
              pBVar15 = local_148[(long)pBVar12] + (local_148[(long)pBVar12] == (BYTE *)0x0);
              if (pBVar12 != (BYTE *)0x1) goto LAB_00139620;
            }
            local_148[1] = local_148[0];
            goto LAB_00139640;
          }
        }
        else {
          pBVar15 = (BYTE *)(((local_1a0.bitContainer << ((byte)local_1a0.bitsConsumed & 0x3f)) >>
                             (-bVar2 & 0x3f)) + (ulong)local_168.table[local_168.state].baseValue);
          local_1a0.bitsConsumed = local_1a0.bitsConsumed + uVar22;
          if (uVar22 == 1) goto LAB_001395d7;
          local_148[1] = local_148[0];
          local_148[2] = pBVar12;
LAB_00139640:
          local_148[1] = local_148[0];
          local_148[0] = pBVar15;
        }
        pBVar12 = local_148[0];
        if (bVar1 == 0) {
          uVar26 = 0;
        }
        else {
          uVar26 = (local_1a0.bitContainer << ((byte)local_1a0.bitsConsumed & 0x3f)) >>
                   (-bVar1 & 0x3f);
          local_1a0.bitsConsumed = local_1a0.bitsConsumed + bVar1;
        }
        if (0x1e < (uint)bVar1 + (uint)bVar14 + uVar22) {
          BIT_reloadDStream(&local_1a0);
        }
        if (bVar14 == 0) {
          local_118 = 0;
        }
        else {
          local_118 = (local_1a0.bitContainer << ((byte)local_1a0.bitsConsumed & 0x3f)) >>
                      (-bVar14 & 0x3f);
          local_1a0.bitsConsumed = local_1a0.bitsConsumed + bVar14;
        }
        uVar26 = uVar26 + uVar21;
        local_118 = local_118 + uVar8;
        pBVar16 = local_148[5] + local_118;
        pBVar28 = local_148[(ulong)(pBVar16 < pBVar12) + 3];
        local_148[5] = pBVar16 + uVar26;
        iVar7 = local_1a0.bitsConsumed + local_178.table[local_178.state].nbBits;
        local_178.state =
             (ulong)((uint)(local_1a0.bitContainer >> (-(char)iVar7 & 0x3fU)) &
                    BIT_mask[local_178.table[local_178.state].nbBits]) +
             (ulong)local_178.table[local_178.state].nextState;
        iVar7 = iVar7 + (uint)local_158.table[local_158.state].nbBits;
        local_158.state =
             (ulong)((uint)(local_1a0.bitContainer >> (-(char)iVar7 & 0x3fU)) &
                    BIT_mask[local_158.table[local_158.state].nbBits]) +
             (ulong)local_158.table[local_158.state].nextState;
        local_1a0.bitsConsumed = iVar7 + (uint)local_168.table[local_168.state].nbBits;
        local_168.state =
             (ulong)((uint)(local_1a0.bitContainer >> (-(char)local_1a0.bitsConsumed & 0x3fU)) &
                    BIT_mask[local_168.table[local_168.state].nbBits]) +
             (ulong)local_168.table[local_168.state].nextState;
        uVar17 = (ulong)((uVar25 & 3) << 5);
        uVar23 = *(ulong *)((long)&sequences[0].litLength + uVar17);
        sVar20 = *(size_t *)((long)&sequences[0].matchLength + uVar17);
        uVar19 = sVar20 + uVar23;
        pBVar15 = local_1c0 + uVar19;
        if (pBVar24 < pBVar15) {
          return 0xffffffffffffffba;
        }
        pBVar13 = litPtr + uVar23;
        if (local_108 < pBVar13) {
          return 0xffffffffffffffec;
        }
        local_e8 = (ulong *)((long)&sequences[0].litLength + uVar17);
        pBVar27 = local_1c0 + uVar23;
        local_1a8 = pBVar12;
        if (local_f0 < pBVar27) {
          sequence.matchLength = *(undefined8 *)((long)&sequences[0].matchLength + uVar17);
          sequence.litLength = *local_e8;
          sequence.offset = *(undefined8 *)((long)&sequences[0].offset + uVar17);
          sequence.match = *(BYTE **)((long)&sequences[0].match + uVar17);
          uVar19 = ZSTD_execSequenceLast7
                             (local_1c0,pBVar24,sequence,&litPtr,local_108,local_1b0,local_f8,
                              local_100);
        }
        else {
          uVar4 = *(ulong *)((long)&sequences[0].offset + uVar17);
          pBVar12 = *(BYTE **)((long)&sequences[0].match + uVar17);
          *(undefined8 *)local_1c0 = *(undefined8 *)litPtr;
          if (8 < uVar23) {
            pBVar18 = local_1c0 + 8;
            do {
              litPtr = litPtr + 8;
              *(undefined8 *)pBVar18 = *(undefined8 *)litPtr;
              pBVar18 = pBVar18 + 8;
            } while (pBVar18 < pBVar27);
          }
          litPtr = pBVar13;
          if ((ulong)((long)pBVar27 - (long)local_1b0) < uVar4) {
            if ((ulong)((long)pBVar27 - (long)local_f8) < uVar4) {
              return 0xffffffffffffffec;
            }
            local_e0 = uVar19;
            if (local_100 < pBVar12 + sVar20) {
              local_c8 = (long)local_100 - (long)pBVar12;
              memmove(pBVar27,pBVar12,local_c8);
              pBVar27 = pBVar27 + local_c8;
              sVar20 = sVar20 - local_c8;
              uVar19 = local_e0;
              if ((pBVar27 <= local_f0) && (pBVar12 = local_1b0, 2 < sVar20)) goto LAB_00139944;
              for (uVar8 = 0; uVar23 = (ulong)uVar8, uVar23 < sVar20; uVar8 = uVar8 + 1) {
                pBVar27[uVar23] = local_1b0[uVar23];
              }
            }
            else {
              memmove(pBVar27,pBVar12,sVar20);
              uVar19 = local_e0;
            }
          }
          else {
LAB_00139944:
            if (uVar4 < 8) {
              iVar7 = *(int *)(ZSTD_execSequence_dec64table + uVar4 * 4);
              *pBVar27 = *pBVar12;
              pBVar27[1] = pBVar12[1];
              pBVar27[2] = pBVar12[2];
              pBVar27[3] = pBVar12[3];
              pBVar13 = pBVar12 + *(uint *)(ZSTD_execSequence_dec32table + uVar4 * 4);
              pBVar12 = pBVar12 + ((ulong)*(uint *)(ZSTD_execSequence_dec32table + uVar4 * 4) -
                                  (long)iVar7);
              *(undefined4 *)(pBVar27 + 4) = *(undefined4 *)pBVar13;
            }
            else {
              *(undefined8 *)pBVar27 = *(undefined8 *)pBVar12;
            }
            pBVar13 = pBVar27 + 8;
            pBVar12 = pBVar12 + 8;
            if (local_d0 < pBVar15) {
              pBVar27 = pBVar13;
              pBVar18 = pBVar12;
              if (pBVar13 < local_f0) {
                do {
                  *(undefined8 *)pBVar27 = *(undefined8 *)pBVar18;
                  pBVar27 = pBVar27 + 8;
                  pBVar18 = pBVar18 + 8;
                } while (pBVar27 < local_f0);
                pBVar12 = pBVar12 + ((long)local_f0 - (long)pBVar13);
                pBVar13 = local_f0;
              }
              for (; pBVar13 < pBVar15; pBVar13 = pBVar13 + 1) {
                BVar3 = *pBVar12;
                pBVar12 = pBVar12 + 1;
                *pBVar13 = BVar3;
              }
            }
            else {
              do {
                *(undefined8 *)pBVar13 = *(undefined8 *)pBVar12;
                pBVar13 = pBVar13 + 8;
                pBVar12 = pBVar12 + 8;
              } while (pBVar13 < pBVar27 + sVar20);
            }
          }
        }
        if (0xffffffffffffff88 < uVar19) {
          return uVar19;
        }
        *local_e8 = local_118;
        local_e8[1] = uVar26;
        local_e8[2] = (ulong)local_1a8;
        local_e8[3] = (ulong)(pBVar16 + ((long)pBVar28 - (long)local_1a8));
        local_1c0 = local_1c0 + uVar19;
        uVar26 = (ulong)(uVar25 + 1);
      }
      if ((int)uVar25 < nbSeq) {
        return 0xffffffffffffffec;
      }
      for (uVar25 = uVar25 - local_d4; (int)uVar25 < nbSeq; uVar25 = uVar25 + 1) {
        uVar23 = (ulong)((uVar25 & 3) << 5);
        uVar19 = *(ulong *)((long)&sequences[0].litLength + uVar23);
        sVar20 = *(size_t *)((long)&sequences[0].matchLength + uVar23);
        uVar26 = sVar20 + uVar19;
        pBVar12 = local_1c0 + uVar26;
        if (pBVar24 < pBVar12) {
          return 0xffffffffffffffba;
        }
        pBVar15 = litPtr + uVar19;
        if (local_108 < pBVar15) {
          return 0xffffffffffffffec;
        }
        pBVar28 = local_1c0 + uVar19;
        if (local_f0 < pBVar28) {
          sequence_01.matchLength = *(undefined8 *)((long)&sequences[0].matchLength + uVar23);
          sequence_01.litLength = *(undefined8 *)((long)&sequences[0].litLength + uVar23);
          sequence_01.offset = *(undefined8 *)((long)&sequences[0].offset + uVar23);
          sequence_01.match = *(BYTE **)((long)&sequences[0].match + uVar23);
          uVar26 = ZSTD_execSequenceLast7
                             (local_1c0,pBVar24,sequence_01,&litPtr,local_108,local_1b0,local_f8,
                              local_100);
        }
        else {
          uVar17 = *(ulong *)((long)&sequences[0].offset + uVar23);
          pBVar16 = *(BYTE **)((long)&sequences[0].match + uVar23);
          *(undefined8 *)local_1c0 = *(undefined8 *)litPtr;
          if (8 < uVar19) {
            pBVar13 = local_1c0 + 8;
            do {
              litPtr = litPtr + 8;
              *(undefined8 *)pBVar13 = *(undefined8 *)litPtr;
              pBVar13 = pBVar13 + 8;
            } while (pBVar13 < pBVar28);
          }
          litPtr = pBVar15;
          if ((ulong)((long)pBVar28 - (long)local_1b0) < uVar17) {
            if ((ulong)((long)pBVar28 - (long)local_f8) < uVar17) {
              return 0xffffffffffffffec;
            }
            if (local_100 < pBVar16 + sVar20) {
              __n = (long)local_100 - (long)pBVar16;
              memmove(pBVar28,pBVar16,__n);
              pBVar28 = pBVar28 + __n;
              sVar20 = sVar20 - __n;
              if ((pBVar28 <= local_f0) && (pBVar16 = local_1b0, 2 < sVar20)) goto LAB_0013a251;
              for (uVar8 = 0; uVar19 = (ulong)uVar8, uVar19 < sVar20; uVar8 = uVar8 + 1) {
                pBVar28[uVar19] = local_1b0[uVar19];
              }
            }
            else {
              memmove(pBVar28,pBVar16,sVar20);
            }
          }
          else {
LAB_0013a251:
            if (uVar17 < 8) {
              iVar7 = *(int *)(ZSTD_execSequence_dec64table + uVar17 * 4);
              *pBVar28 = *pBVar16;
              pBVar28[1] = pBVar16[1];
              pBVar28[2] = pBVar16[2];
              pBVar28[3] = pBVar16[3];
              pBVar15 = pBVar16 + *(uint *)(ZSTD_execSequence_dec32table + uVar17 * 4);
              pBVar16 = pBVar16 + ((ulong)*(uint *)(ZSTD_execSequence_dec32table + uVar17 * 4) -
                                  (long)iVar7);
              *(undefined4 *)(pBVar28 + 4) = *(undefined4 *)pBVar15;
            }
            else {
              *(undefined8 *)pBVar28 = *(undefined8 *)pBVar16;
            }
            pBVar15 = pBVar28 + 8;
            pBVar16 = pBVar16 + 8;
            if (local_d0 < pBVar12) {
              pBVar28 = pBVar15;
              pBVar13 = pBVar16;
              if (pBVar15 < local_f0) {
                do {
                  *(undefined8 *)pBVar28 = *(undefined8 *)pBVar13;
                  pBVar28 = pBVar28 + 8;
                  pBVar13 = pBVar13 + 8;
                } while (pBVar28 < local_f0);
                pBVar16 = pBVar16 + ((long)local_f0 - (long)pBVar15);
                pBVar15 = local_f0;
              }
              for (; pBVar15 < pBVar12; pBVar15 = pBVar15 + 1) {
                BVar3 = *pBVar16;
                pBVar16 = pBVar16 + 1;
                *pBVar15 = BVar3;
              }
            }
            else {
              do {
                *(undefined8 *)pBVar15 = *(undefined8 *)pBVar16;
                pBVar15 = pBVar15 + 8;
                pBVar16 = pBVar16 + 8;
              } while (pBVar15 < pBVar28 + sVar20);
            }
          }
        }
        if (0xffffffffffffff88 < uVar26) {
          return uVar26;
        }
        local_1c0 = local_1c0 + uVar26;
      }
      for (lVar11 = 0; pBVar12 = local_108, lVar11 != 3; lVar11 = lVar11 + 1) {
        (dctx->entropy).rep[lVar11] = *(U32 *)(local_148 + lVar11);
      }
    }
  }
  sVar20 = (long)pBVar12 - (long)litPtr;
  if (sVar20 <= (ulong)((long)pBVar24 - (long)local_1c0)) {
    memcpy(local_1c0,litPtr,sVar20);
    return (size_t)(local_1c0 + (sVar20 - (long)dst));
  }
  return 0xffffffffffffffba;
}

Assistant:

size_t
ZSTD_decompressBlock_internal(ZSTD_DCtx* dctx,
                              void* dst, size_t dstCapacity,
                        const void* src, size_t srcSize, const int frame)
{   /* blockType == blockCompressed */
    const BYTE* ip = (const BYTE*)src;
    /* isLongOffset must be true if there are long offsets.
     * Offsets are long if they are larger than 2^STREAM_ACCUMULATOR_MIN.
     * We don't expect that to be the case in 64-bit mode.
     * In block mode, window size is not known, so we have to be conservative.
     * (note: but it could be evaluated from current-lowLimit)
     */
    ZSTD_longOffset_e const isLongOffset = (ZSTD_longOffset_e)(MEM_32bits() && (!frame || (dctx->fParams.windowSize > (1ULL << STREAM_ACCUMULATOR_MIN))));
    DEBUGLOG(5, "ZSTD_decompressBlock_internal (size : %u)", (U32)srcSize);

    RETURN_ERROR_IF(srcSize >= ZSTD_BLOCKSIZE_MAX, srcSize_wrong);

    /* Decode literals section */
    {   size_t const litCSize = ZSTD_decodeLiteralsBlock(dctx, src, srcSize);
        DEBUGLOG(5, "ZSTD_decodeLiteralsBlock : %u", (U32)litCSize);
        if (ZSTD_isError(litCSize)) return litCSize;
        ip += litCSize;
        srcSize -= litCSize;
    }

    /* Build Decoding Tables */
    {
        /* These macros control at build-time which decompressor implementation
         * we use. If neither is defined, we do some inspection and dispatch at
         * runtime.
         */
#if !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT) && \
    !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG)
        int usePrefetchDecoder = dctx->ddictIsCold;
#endif
        int nbSeq;
        size_t const seqHSize = ZSTD_decodeSeqHeaders(dctx, &nbSeq, ip, srcSize);
        if (ZSTD_isError(seqHSize)) return seqHSize;
        ip += seqHSize;
        srcSize -= seqHSize;

#if !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT) && \
    !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG)
        if ( !usePrefetchDecoder
          && (!frame || (dctx->fParams.windowSize > (1<<24)))
          && (nbSeq>ADVANCED_SEQS) ) {  /* could probably use a larger nbSeq limit */
            U32 const shareLongOffsets = ZSTD_getLongOffsetsShare(dctx->OFTptr);
            U32 const minShare = MEM_64bits() ? 7 : 20; /* heuristic values, correspond to 2.73% and 7.81% */
            usePrefetchDecoder = (shareLongOffsets >= minShare);
        }
#endif

        dctx->ddictIsCold = 0;

#if !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT) && \
    !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG)
        if (usePrefetchDecoder)
#endif
#ifndef ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT
            return ZSTD_decompressSequencesLong(dctx, dst, dstCapacity, ip, srcSize, nbSeq, isLongOffset);
#endif

#ifndef ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG
        /* else */
        return ZSTD_decompressSequences(dctx, dst, dstCapacity, ip, srcSize, nbSeq, isLongOffset);
#endif
    }
}